

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int sqlite3IsReadOnly(Parse *pParse,Table *pTab,Trigger *pTrigger)

{
  VTable *pVVar1;
  sqlite3 *psVar2;
  VTable *pVVar3;
  u8 uVar4;
  uint uVar5;
  char *zFormat;
  
  uVar4 = pTab->eTabType;
  if (uVar4 == '\x01') {
    pVVar1 = (pTab->u).vtab.p;
    psVar2 = pVVar1->db;
    pVVar3 = pVVar1;
    while (psVar2 != pParse->db) {
      pVVar3 = pVVar3->pNext;
      psVar2 = pVVar3->db;
    }
    if (pVVar3->pMod->pModule->xUpdate ==
        (_func_int_sqlite3_vtab_ptr_int_sqlite3_value_ptr_ptr_sqlite3_int64_ptr *)0x0) {
LAB_001945ec:
      zFormat = "table %s may not be modified";
      goto LAB_001945f3;
    }
    if (pParse->pToplevel == (Parse *)0x0) {
      return 0;
    }
    if ((uint)pVVar1->eVtabRisk <= ((uint)pParse->db->flags >> 7 & 1)) {
      return 0;
    }
    sqlite3ErrorMsg(pParse,"unsafe use of virtual table \"%s\"",pTab->zName);
    uVar4 = pTab->eTabType;
  }
  else if ((pTab->tabFlags & 0x1001) != 0) {
    psVar2 = pParse->db;
    uVar5 = (uint)psVar2->flags;
    if ((pTab->tabFlags & 1) == 0) {
      if ((((uVar5 >> 0x1c & 1) != 0) &&
          ((psVar2->pVtabCtx == (VtabCtx *)0x0 && (psVar2->nVdbeExec == 0)))) &&
         ((zFormat = "table %s may not be modified", psVar2->nVTrans < 1 ||
          (psVar2->aVTrans != (VTable **)0x0)))) goto LAB_001945f3;
    }
    else if (((uVar5 & 0x10000001) != 1) && (pParse->nested == '\0')) goto LAB_001945ec;
  }
  if (uVar4 != '\x02') {
    return 0;
  }
  zFormat = "cannot modify %s because it is a view";
  if (pTrigger != (Trigger *)0x0) {
    if (pTrigger->bReturning == '\0') {
      return 0;
    }
    if (pTrigger->pNext != (Trigger *)0x0) {
      return 0;
    }
  }
LAB_001945f3:
  sqlite3ErrorMsg(pParse,zFormat,pTab->zName);
  return 1;
}

Assistant:

SQLITE_PRIVATE int sqlite3IsReadOnly(Parse *pParse, Table *pTab, Trigger *pTrigger){
  if( tabIsReadOnly(pParse, pTab) ){
    sqlite3ErrorMsg(pParse, "table %s may not be modified", pTab->zName);
    return 1;
  }
#ifndef SQLITE_OMIT_VIEW
  if( IsView(pTab)
   && (pTrigger==0 || (pTrigger->bReturning && pTrigger->pNext==0))
  ){
    sqlite3ErrorMsg(pParse,"cannot modify %s because it is a view",pTab->zName);
    return 1;
  }
#endif
  return 0;
}